

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O2

void __thiscall r_exec::CSTController::CSTController(CSTController *this,View *view)

{
  atomic_int_fast64_t *paVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  int iVar6;
  CSTOverlay *this_00;
  Code *pCVar7;
  undefined4 extraout_var;
  long *plVar8;
  long lVar9;
  ushort uVar10;
  bool bVar11;
  P<r_exec::Overlay> local_48;
  vector<core::P<r_exec::HLPController>,std::allocator<core::P<r_exec::HLPController>>> *local_40;
  Group *local_38;
  
  HLPController::HLPController(&this->super_HLPController,view);
  (this->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__CSTController_001d0570;
  (this->m_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this_00 = (CSTOverlay *)operator_new(0x148);
  CSTOverlay::CSTOverlay
            (this_00,(Controller *)this,(HLPBindingMap *)(this->super_HLPController).bindings.object
            );
  CSTOverlay::load_patterns(this_00);
  LOCK();
  paVar1 = &(this_00->super_HLPOverlay).super_Overlay.super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_48.object = (_Object *)this_00;
  r_code::list<core::P<r_exec::Overlay>_>::push_back
            (&(this->super_HLPController).super_OController.overlays,&local_48);
  core::P<r_exec::Overlay>::~P(&local_48);
  local_38 = HLPController::get_host(&this->super_HLPController);
  pCVar7 = HLPController::get_unpacked_object(&this->super_HLPController);
  (*(pCVar7->super__Object)._vptr__Object[4])(pCVar7,2);
  uVar3 = r_code::Atom::asIndex();
  (*(pCVar7->super__Object)._vptr__Object[4])(pCVar7,(ulong)uVar3);
  bVar2 = r_code::Atom::getAtomCount();
  uVar10 = (ushort)bVar2;
  local_40 = (vector<core::P<r_exec::HLPController>,std::allocator<core::P<r_exec::HLPController>>>
              *)&(this->super_HLPController).controllers;
  while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
    (*(pCVar7->super__Object)._vptr__Object[4])(pCVar7,(ulong)(ushort)(uVar3 + 1));
    uVar4 = r_code::Atom::asIndex();
    iVar6 = (*(pCVar7->super__Object)._vptr__Object[9])(pCVar7,(ulong)uVar4);
    plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x48))
                               ((long *)CONCAT44(extraout_var,iVar6),0);
    (**(code **)(*plVar8 + 0x20))(plVar8,0);
    sVar5 = r_code::Atom::asOpcode();
    if ((sVar5 == Opcodes::ICst) || (sVar5 == Opcodes::IMdl)) {
      plVar8 = (long *)(**(code **)(*plVar8 + 0x48))(plVar8,0);
      lVar9 = (**(code **)(*plVar8 + 0xc0))(plVar8,local_38,1);
      if (lVar9 != 0) {
        local_48.object = *(_Object **)(lVar9 + 0xb0);
        if ((CSTOverlay *)local_48.object != (CSTOverlay *)0x0) {
          LOCK();
          paVar1 = &(((CSTOverlay *)local_48.object)->super_HLPOverlay).super_Overlay.super__Object.
                    refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        std::vector<core::P<r_exec::HLPController>,std::allocator<core::P<r_exec::HLPController>>>::
        emplace_back<core::P<r_exec::HLPController>>(local_40,(P<r_exec::HLPController> *)&local_48)
        ;
        core::P<r_exec::HLPController>::~P((P<r_exec::HLPController> *)&local_48);
      }
    }
  }
  return;
}

Assistant:

CSTController::CSTController(r_code::View *view): HLPController(view)
{
    CSTOverlay *o = new CSTOverlay(this, bindings); // master overlay.
    o->load_patterns();
    overlays.push_back(o);
    Group *host = get_host();
    Code *object = get_unpacked_object();
    uint16_t obj_set_index = object->code(CST_OBJS).asIndex();
    uint16_t obj_count = object->code(obj_set_index).getAtomCount();

    for (uint16_t i = 0; i < obj_count; ++i) {
        Code *pattern = object->get_reference(object->code(obj_set_index + 1).asIndex());
        Code *pattern_ihlp = pattern->get_reference(0);
        uint16_t opcode = pattern_ihlp->code(0).asOpcode();

        if (opcode == Opcodes::ICst ||
            opcode == Opcodes::IMdl) {
            Code *pattern_hlp = pattern_ihlp->get_reference(0);
            r_exec::View *pattern_hlp_v = (r_exec::View*)pattern_hlp->get_view(host, true);

            if (pattern_hlp_v) {
                controllers.push_back((HLPController *)pattern_hlp_v->controller);
            }
        }
    }
}